

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O1

void __thiscall
MutableS2ShapeIndex::UpdateEdges
          (MutableS2ShapeIndex *this,S2PaddedCell *pcell,
          vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          *edges,InteriorTracker *tracker,EdgeAllocator *alloc,bool disjoint_from_index)

{
  undefined8 *puVar1;
  double u;
  void *pvVar2;
  EdgeAllocator *alloc_00;
  bool bVar3;
  CellRelation CVar4;
  R2Rect *pRVar5;
  ClippedEdge *edge;
  ClippedEdge *pCVar6;
  uint uVar7;
  int i;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  *child_edges_00;
  int pos;
  undefined8 unaff_RBX;
  undefined7 uVar12;
  undefined1 *puVar8;
  ulong uVar9;
  undefined1 *puVar10;
  long lVar11;
  undefined4 uVar13;
  undefined7 uVar14;
  undefined7 in_register_00000089;
  R1Interval *middle;
  long lVar15;
  const_iterator cVar16;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  child_edges [2] [2];
  undefined1 auStack_148 [8];
  S2PaddedCell *local_140;
  MutableS2ShapeIndex *local_138;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  *local_130;
  EdgeAllocator *local_128;
  undefined4 local_120;
  uint local_11c;
  undefined1 local_118 [24];
  MutableS2ShapeIndex *pMStack_100;
  iterator iStack_f8;
  ClippedEdge **ppCStack_f0;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  local_e8;
  undefined8 uStack_d0;
  iterator local_c8;
  ClippedEdge **ppCStack_c0;
  size_t local_b0;
  InteriorTracker *local_a8;
  S2PaddedCell local_a0;
  S2LogMessage local_40;
  
  uVar9 = CONCAT71(in_register_00000089,disjoint_from_index) & 0xffffffff;
  uVar13 = (undefined4)CONCAT71(in_register_00000089,disjoint_from_index);
  if ((edges->
      super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (edges->
      super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = (tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
    uVar12 = (undefined7)((ulong)unaff_RBX >> 8);
  }
  else {
    bVar3 = false;
    uVar12 = 0;
  }
  local_140 = pcell;
  local_138 = this;
  local_130 = edges;
  if (bVar3) {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
               ,0x3fe,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: !edges->empty() || !tracker->shape_ids().empty() ",
               0x3f);
    if (bVar3) goto LAB_00194e12;
  }
  if ((char)uVar9 == '\0') {
    local_118._8_8_ = 0xffffffffffffffff;
    local_118._16_8_ = (__pointer_type)0x0;
    local_118._0_8_ = &PTR__IteratorBase_002c10d0;
    iStack_f8._M_current = (ClippedEdge **)0x0;
    ppCStack_f0._0_4_ = -1;
    local_e8.
    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = -1;
    pMStack_100 = local_138;
    cVar16 = gtl::internal_btree::
             btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
             ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                    *)&local_138->cell_map_);
    iStack_f8._M_current = (ClippedEdge **)cVar16.node;
    local_e8.
    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_e8.
                           super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,cVar16.position);
    ppCStack_f0 = (ClippedEdge **)CONCAT44(ppCStack_f0._4_4_,cVar16.position);
    local_118._8_8_ = (ClippedEdge **)0xffffffffffffffff;
    local_118._16_8_ = (__pointer_type)0x0;
    local_e8.
    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
    ._M_impl.super__Vector_impl_data._M_start = iStack_f8._M_current;
    CVar4 = S2ShapeIndex::IteratorBase::LocateImpl<MutableS2ShapeIndex::Iterator>
                      ((S2CellId)(local_140->id_).id_,(Iterator *)local_118);
    uVar14 = (undefined7)(uVar9 >> 8);
    if (CVar4 == INDEXED) {
      uVar9 = CONCAT71(uVar12,1);
      AbsorbIndexCell(local_138,local_140,(Iterator *)local_118,local_130,tracker,alloc);
      uVar13 = (undefined4)CONCAT71(uVar14,1);
      goto LAB_00194994;
    }
    if (CVar4 == DISJOINT) {
      uVar13 = (undefined4)CONCAT71(uVar14,1);
    }
    else if (CVar4 != SUBDIVIDED) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
                 ,0x428,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_a0.padding_,"Check failed: (SUBDIVIDED) == (r) ",0x22);
LAB_00194e12:
      abort();
    }
  }
  uVar9 = 0;
LAB_00194994:
  if (((char)uVar13 == '\0') ||
     (bVar3 = MakeIndexCell(local_138,local_140,local_130,tracker), !bVar3)) {
    local_11c = (uint)uVar9;
    puVar8 = local_118;
    local_c8._M_current = (ClippedEdge **)0x0;
    ppCStack_c0 = (ClippedEdge **)0x0;
    local_e8.
    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (ClippedEdge **)0x0;
    uStack_d0 = 0;
    local_e8.
    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (ClippedEdge **)0x0;
    iStack_f8._M_current = (ClippedEdge **)0x0;
    ppCStack_f0 = (ClippedEdge **)0x0;
    local_118._16_8_ = (__pointer_type)0x0;
    pMStack_100 = (MutableS2ShapeIndex *)0x0;
    local_118._0_8_ = (pointer)0x0;
    local_118._8_8_ = (ClippedEdge **)0x0;
    uVar7 = (uint)((ulong)((long)(local_130->
                                 super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_130->
                                super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3);
    lVar11 = 0;
    local_128 = alloc;
    local_a8 = tracker;
    do {
      lVar15 = 0;
      do {
        std::
        vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
        ::reserve((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                   *)(puVar8 + lVar15),(long)(int)uVar7);
        alloc_00 = local_128;
        lVar15 = lVar15 + 0x18;
      } while (lVar15 == 0x18);
      puVar8 = puVar8 + 0x30;
      bVar3 = lVar11 == 0;
      lVar11 = lVar11 + 1;
    } while (bVar3);
    local_b0 = local_128->size_;
    local_120 = uVar13;
    pRVar5 = S2PaddedCell::middle(local_140);
    if (0 < (int)uVar7) {
      middle = pRVar5->bounds_ + 1;
      uVar9 = 0;
      do {
        pCVar6 = (local_130->
                 super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar9];
        child_edges_00 =
             (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
              *)local_118;
        if ((pCVar6->bound).bounds_[0].bounds_.c_[1] <= pRVar5->bounds_[0].bounds_.c_[0]) {
LAB_00194b07:
          ClipVAxis(pCVar6,middle,child_edges_00,alloc_00);
        }
        else {
          u = pRVar5->bounds_[0].bounds_.c_[1];
          child_edges_00 = &local_e8;
          if (u <= (pCVar6->bound).bounds_[0].bounds_.c_[0]) goto LAB_00194b07;
          if ((pCVar6->bound).bounds_[1].bounds_.c_[1] <= (middle->bounds_).c_[0]) {
            local_a0.id_.id_ = (uint64)ClipUBound(pCVar6,1,u,alloc_00);
            if (local_118._8_8_ == local_118._16_8_) {
              std::
              vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
              ::_M_realloc_insert<MutableS2ShapeIndex::ClippedEdge_const*>
                        ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                          *)local_118,(iterator)local_118._8_8_,(ClippedEdge **)&local_a0);
            }
            else {
              *(uint64 *)local_118._8_8_ = local_a0.id_.id_;
              local_118._8_8_ = local_118._8_8_ + 8;
            }
            local_a0.id_.id_ =
                 (uint64)ClipUBound(pCVar6,0,pRVar5->bounds_[0].bounds_.c_[0],alloc_00);
            if (local_e8.
                super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_e8.
                super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
              ::_M_realloc_insert<MutableS2ShapeIndex::ClippedEdge_const*>
                        ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                          *)&local_e8,
                         (iterator)
                         local_e8.
                         super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(ClippedEdge **)&local_a0);
            }
            else {
              *local_e8.
               super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
               ._M_impl.super__Vector_impl_data._M_finish = (ClippedEdge *)local_a0.id_.id_;
              local_e8.
              super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_e8.
                   super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          else if (pRVar5->bounds_[1].bounds_.c_[1] <= (pCVar6->bound).bounds_[1].bounds_.c_[0]) {
            local_a0.id_.id_ = (uint64)ClipUBound(pCVar6,1,u,alloc_00);
            if (iStack_f8._M_current == ppCStack_f0) {
              std::
              vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
              ::_M_realloc_insert<MutableS2ShapeIndex::ClippedEdge_const*>
                        ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                          *)&pMStack_100,iStack_f8,(ClippedEdge **)&local_a0);
            }
            else {
              *iStack_f8._M_current = (ClippedEdge *)local_a0.id_.id_;
              iStack_f8._M_current = iStack_f8._M_current + 1;
            }
            local_a0.id_.id_ =
                 (uint64)ClipUBound(pCVar6,0,pRVar5->bounds_[0].bounds_.c_[0],alloc_00);
            if (local_c8._M_current == ppCStack_c0) {
              std::
              vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
              ::_M_realloc_insert<MutableS2ShapeIndex::ClippedEdge_const*>
                        ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                          *)&uStack_d0,local_c8,(ClippedEdge **)&local_a0);
            }
            else {
              *local_c8._M_current = (ClippedEdge *)local_a0.id_.id_;
              local_c8._M_current = local_c8._M_current + 1;
            }
          }
          else {
            edge = ClipUBound(pCVar6,1,u,alloc_00);
            ClipVAxis(edge,middle,
                      (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                       *)local_118,alloc_00);
            pCVar6 = ClipUBound(pCVar6,0,pRVar5->bounds_[0].bounds_.c_[0],alloc_00);
            ClipVAxis(pCVar6,middle,&local_e8,alloc_00);
          }
        }
        uVar9 = uVar9 + 1;
      } while ((uVar7 & 0x7fffffff) != uVar9);
    }
    tracker = local_a8;
    uVar13 = local_120;
    lVar11 = 0;
    puVar8 = auStack_148;
    do {
      puVar10 = puVar8 + 0x30;
      lVar15 = 0;
      do {
        pvVar2 = *(void **)(puVar10 + lVar15);
        if (pvVar2 == *(void **)(puVar8 + lVar15 + 0x38)) {
          puVar1 = (undefined8 *)(puVar10 + lVar15);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1[2] = 0;
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2);
          }
        }
        lVar15 = lVar15 + 0x18;
      } while (lVar15 == 0x18);
      bVar3 = lVar11 == 0;
      lVar11 = lVar11 + 1;
      puVar8 = puVar10;
    } while (bVar3);
    lVar11 = 0;
    do {
      i = (int)*(uint *)(S2::internal::kPosToIJ + lVar11 * 4 + (long)local_140->orientation_ * 0x10)
          >> 1;
      uVar7 = *(uint *)(S2::internal::kPosToIJ + lVar11 * 4 + (long)local_140->orientation_ * 0x10)
              & 1;
      uVar9 = (ulong)uVar7;
      lVar15 = (long)i * 0x30;
      if ((*(long *)(local_118 + uVar9 * 0x18 + lVar15) !=
           *(long *)(local_118 + uVar9 * 0x18 + lVar15 + 8)) ||
         ((tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        S2PaddedCell::S2PaddedCell(&local_a0,local_140,i,uVar7);
        UpdateEdges(local_138,&local_a0,
                    (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                     *)(local_118 + uVar9 * 0x18 + lVar15),tracker,local_128,SUB41(uVar13,0));
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    local_128->size_ = local_b0;
    lVar11 = 0x48;
    do {
      if (*(void **)(local_118 + lVar11) != (void *)0x0) {
        operator_delete(*(void **)(local_118 + lVar11));
      }
      lVar11 = lVar11 + -0x18;
    } while (lVar11 != -0x18);
    uVar9 = (ulong)local_11c;
  }
  if ((char)uVar9 != '\0') {
    InteriorTracker::RestoreStateBefore(tracker,local_138->pending_additions_begin_);
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::UpdateEdges(const S2PaddedCell& pcell,
                                      vector<const ClippedEdge*>* edges,
                                      InteriorTracker* tracker,
                                      EdgeAllocator* alloc,
                                      bool disjoint_from_index) {
  // Cases where an index cell is not needed should be detected before this.
  S2_DCHECK(!edges->empty() || !tracker->shape_ids().empty());

  // This function is recursive with a maximum recursion depth of 30
  // (S2CellId::kMaxLevel).  Note that using an explicit stack does not seem
  // to be any faster based on profiling.

  // Incremental updates are handled as follows.  All edges being added or
  // removed are combined together in "edges", and all shapes with interiors
  // are tracked using "tracker".  We subdivide recursively as usual until we
  // encounter an existing index cell.  At this point we "absorb" the index
  // cell as follows:
  //
  //   - Edges and shapes that are being removed are deleted from "edges" and
  //     "tracker".
  //   - All remaining edges and shapes from the index cell are added to
  //     "edges" and "tracker".
  //   - Continue subdividing recursively, creating new index cells as needed.
  //   - When the recursion gets back to the cell that was absorbed, we
  //     restore "edges" and "tracker" to their previous state.
  //
  // Note that the only reason that we include removed shapes in the recursive
  // subdivision process is so that we can find all of the index cells that
  // contain those shapes efficiently, without maintaining an explicit list of
  // index cells for each shape (which would be expensive in terms of memory).
  bool index_cell_absorbed = false;
  if (!disjoint_from_index) {
    // There may be existing index cells contained inside "pcell".  If we
    // encounter such a cell, we need to combine the edges being updated with
    // the existing cell contents by "absorbing" the cell.
    // Use InitStale() to avoid applying updated recursively.
    Iterator iter;
    iter.InitStale(this);
    CellRelation r = iter.Locate(pcell.id());
    if (r == DISJOINT) {
      disjoint_from_index = true;
    } else if (r == INDEXED) {
      // Absorb the index cell by transferring its contents to "edges" and
      // deleting it.  We also start tracking the interior of any new shapes.
      AbsorbIndexCell(pcell, iter, edges, tracker, alloc);
      index_cell_absorbed = true;
      disjoint_from_index = true;
    } else {
      S2_DCHECK_EQ(SUBDIVIDED, r);
    }
  }

  // If there are existing index cells below us, then we need to keep
  // subdividing so that we can merge with those cells.  Otherwise,
  // MakeIndexCell checks if the number of edges is small enough, and creates
  // an index cell if possible (returning true when it does so).
  if (!disjoint_from_index || !MakeIndexCell(pcell, *edges, tracker)) {
    // Reserve space for the edges that will be passed to each child.  This is
    // important since otherwise the running time is dominated by the time
    // required to grow the vectors.  The amount of memory involved is
    // relatively small, so we simply reserve the maximum space for every child.
    vector<const ClippedEdge*> child_edges[2][2];  // [i][j]
    int num_edges = edges->size();
    for (int i = 0; i < 2; ++i) {
      for (int j = 0; j < 2; ++j) {
        child_edges[i][j].reserve(num_edges);
      }
    }

    // Remember the current size of the EdgeAllocator so that we can free any
    // edges that are allocated during edge splitting.
    size_t alloc_size = alloc->size();

    // Compute the middle of the padded cell, defined as the rectangle in
    // (u,v)-space that belongs to all four (padded) children.  By comparing
    // against the four boundaries of "middle" we can determine which children
    // each edge needs to be propagated to.
    const R2Rect& middle = pcell.middle();

    // Build up a vector edges to be passed to each child cell.  The (i,j)
    // directions are left (i=0), right (i=1), lower (j=0), and upper (j=1).
    // Note that the vast majority of edges are propagated to a single child.
    // This case is very fast, consisting of between 2 and 4 floating-point
    // comparisons and copying one pointer.  (ClipVAxis is inline.)
    for (int e = 0; e < num_edges; ++e) {
      const ClippedEdge* edge = (*edges)[e];
      if (edge->bound[0].hi() <= middle[0].lo()) {
        // Edge is entirely contained in the two left children.
        ClipVAxis(edge, middle[1], child_edges[0], alloc);
      } else if (edge->bound[0].lo() >= middle[0].hi()) {
        // Edge is entirely contained in the two right children.
        ClipVAxis(edge, middle[1], child_edges[1], alloc);
      } else if (edge->bound[1].hi() <= middle[1].lo()) {
        // Edge is entirely contained in the two lower children.
        child_edges[0][0].push_back(ClipUBound(edge, 1, middle[0].hi(), alloc));
        child_edges[1][0].push_back(ClipUBound(edge, 0, middle[0].lo(), alloc));
      } else if (edge->bound[1].lo() >= middle[1].hi()) {
        // Edge is entirely contained in the two upper children.
        child_edges[0][1].push_back(ClipUBound(edge, 1, middle[0].hi(), alloc));
        child_edges[1][1].push_back(ClipUBound(edge, 0, middle[0].lo(), alloc));
      } else {
        // The edge bound spans all four children.  The edge itself intersects
        // either three or four (padded) children.
        const ClippedEdge* left = ClipUBound(edge, 1, middle[0].hi(), alloc);
        ClipVAxis(left, middle[1], child_edges[0], alloc);
        const ClippedEdge* right = ClipUBound(edge, 0, middle[0].lo(), alloc);
        ClipVAxis(right, middle[1], child_edges[1], alloc);
      }
    }
    // Free any memory reserved for children that turned out to be empty.  This
    // step is cheap and reduces peak memory usage by about 10% when building
    // large indexes (> 10M edges).
    for (int i = 0; i < 2; ++i) {
      for (int j = 0; j < 2; ++j) {
        if (child_edges[i][j].empty()) {
          vector<const ClippedEdge*>().swap(child_edges[i][j]);
        }
      }
    }
    // Now recursively update the edges in each child.  We call the children in
    // increasing order of S2CellId so that when the index is first constructed,
    // all insertions into cell_map_ are at the end (which is much faster).
    for (int pos = 0; pos < 4; ++pos) {
      int i, j;
      pcell.GetChildIJ(pos, &i, &j);
      if (!child_edges[i][j].empty() || !tracker->shape_ids().empty()) {
        UpdateEdges(S2PaddedCell(pcell, i, j), &child_edges[i][j],
                    tracker, alloc, disjoint_from_index);
      }
    }
    // Free any temporary edges that were allocated during clipping.
    alloc->Reset(alloc_size);
  }
  if (index_cell_absorbed) {
    // Restore the state for any edges being removed that we are tracking.
    tracker->RestoreStateBefore(pending_additions_begin_);
  }
}